

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedModel.pb.h
# Opt level: O1

bool CoreML::Specification::operator==(LinkedModel *a,LinkedModel *b)

{
  string *psVar1;
  string *psVar2;
  size_t sVar3;
  int iVar4;
  StringParameter *pSVar5;
  LinkedModelFile *pLVar6;
  
  if (a->_oneof_case_[0] != b->_oneof_case_[0]) {
    return false;
  }
  if (a->_oneof_case_[0] != 1) {
    return true;
  }
  pSVar5 = ((a->LinkType_).linkedmodelfile_)->linkedmodelfilename_;
  if (pSVar5 == (StringParameter *)0x0) {
    pSVar5 = (StringParameter *)&_StringParameter_default_instance_;
  }
  psVar1 = (pSVar5->defaultvalue_).ptr_;
  if (b->_oneof_case_[0] == 1) {
    pLVar6 = (b->LinkType_).linkedmodelfile_;
  }
  else {
    pLVar6 = LinkedModelFile::default_instance();
  }
  pSVar5 = pLVar6->linkedmodelfilename_;
  if (pSVar5 == (StringParameter *)0x0) {
    pSVar5 = (StringParameter *)&_StringParameter_default_instance_;
  }
  psVar2 = (pSVar5->defaultvalue_).ptr_;
  sVar3 = psVar1->_M_string_length;
  if ((sVar3 == psVar2->_M_string_length) &&
     ((sVar3 == 0 ||
      (iVar4 = bcmp((psVar1->_M_dataplus)._M_p,(psVar2->_M_dataplus)._M_p,sVar3), iVar4 == 0)))) {
    if (a->_oneof_case_[0] == 1) {
      pLVar6 = (a->LinkType_).linkedmodelfile_;
    }
    else {
      pLVar6 = LinkedModelFile::default_instance();
    }
    pSVar5 = pLVar6->linkedmodelsearchpath_;
    if (pSVar5 == (StringParameter *)0x0) {
      pSVar5 = (StringParameter *)&_StringParameter_default_instance_;
    }
    psVar1 = (pSVar5->defaultvalue_).ptr_;
    if (b->_oneof_case_[0] == 1) {
      pLVar6 = (b->LinkType_).linkedmodelfile_;
    }
    else {
      pLVar6 = LinkedModelFile::default_instance();
    }
    pSVar5 = pLVar6->linkedmodelsearchpath_;
    if (pSVar5 == (StringParameter *)0x0) {
      pSVar5 = (StringParameter *)&_StringParameter_default_instance_;
    }
    psVar2 = (pSVar5->defaultvalue_).ptr_;
    sVar3 = psVar1->_M_string_length;
    if (sVar3 == psVar2->_M_string_length) {
      if (sVar3 == 0) {
        return true;
      }
      iVar4 = bcmp((psVar1->_M_dataplus)._M_p,(psVar2->_M_dataplus)._M_p,sVar3);
      if (iVar4 == 0) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

inline LinkedModel::LinkTypeCase LinkedModel::LinkType_case() const {
  return LinkedModel::LinkTypeCase(_oneof_case_[0]);
}